

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_manager.cc
# Opt level: O0

void __thiscall xsettingsd::SettingsManager::RunEventLoop(SettingsManager *this)

{
  Window win;
  undefined8 uVar1;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  reference puVar7;
  size_t size;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Stack_10198;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Stack_10190;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Stack_10188;
  const_iterator it;
  DataWriter writer;
  char data [65536];
  fd_set *__arr;
  undefined1 local_158 [4];
  uint __i;
  fd_set fds;
  XEvent event;
  int x11_fd;
  SettingsManager *this_local;
  
  iVar3 = XConnectionNumber(this->display_);
  while( true ) {
    while (iVar4 = XPending(this->display_), iVar4 == 0) {
      for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
        *(undefined8 *)(local_158 + (ulong)__arr._4_4_ * 8) = 0;
      }
      *(ulong *)(local_158 + (long)(iVar3 / 0x40) * 8) =
           1L << ((byte)((long)iVar3 % 0x40) & 0x3f) |
           *(ulong *)(local_158 + (long)(iVar3 / 0x40) * 8);
      iVar4 = select(iVar3 + 1,(fd_set *)local_158,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      if (iVar4 == -1) {
        piVar5 = __errno_location();
        __stream = _stderr;
        uVar1 = kProgName;
        if (*piVar5 != 4) {
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          fprintf(__stream,"%s: select() failed: %s\n",uVar1,pcVar6);
          return;
        }
        fprintf(_stderr,"%s: Reloading configuration\n",kProgName);
        bVar2 = LoadConfig(this);
        if (bVar2) {
          DataWriter::DataWriter((DataWriter *)&it,(char *)&writer.bytes_written_,0x10000);
          bVar2 = WriteProperty(this,(DataWriter *)&it);
          if (bVar2) {
            _Stack_10190._M_current =
                 (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->windows_);
            __gnu_cxx::
            __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ::__normal_iterator<unsigned_long*>
                      ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                        *)&_Stack_10188,&_Stack_10190);
            while( true ) {
              _Stack_10198._M_current =
                   (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->windows_);
              bVar2 = __gnu_cxx::operator!=(&_Stack_10188,&_Stack_10198);
              if (!bVar2) break;
              puVar7 = __gnu_cxx::
                       __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ::operator*(&_Stack_10188);
              win = *puVar7;
              size = DataWriter::bytes_written((DataWriter *)&it);
              SetPropertyOnWindow(this,win,(char *)&writer.bytes_written_,size);
              __gnu_cxx::
              __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator++(&_Stack_10188);
            }
          }
        }
      }
    }
    XNextEvent(this->display_,fds.fds_bits + 0xf);
    if ((uint)fds.fds_bits[0xf] == 0x1d) break;
    if ((uint)fds.fds_bits[0xf] == 0x22) {
      XRefreshKeyboardMapping(fds.fds_bits + 0xf);
    }
    else {
      fprintf(_stderr,"%s: Ignoring event of type %d\n",kProgName,(ulong)(uint)fds.fds_bits[0xf]);
    }
  }
  fprintf(_stderr,"%s: 0x%x took a selection from us; exiting\n",kProgName,
          event.xerror.serial & 0xffffffff);
  DestroyWindows(this);
  return;
}

Assistant:

void SettingsManager::RunEventLoop() {
  int x11_fd = XConnectionNumber(display_);
  // TODO: Need to also use XAddConnectionWatch()?

  while (true) {
    // Rather than blocking in XNextEvent(), we just read all the available
    // events here.  We block in select() instead, so that we'll get EINTR
    // if a SIGHUP came in to ask us to reload the config.
    while (XPending(display_)) {
      XEvent event;
      XNextEvent(display_, &event);

      switch (event.type) {
        case MappingNotify:
          // Doesn't really mean anything to us, but might as well handle it.
          XRefreshKeyboardMapping(&(event.xmapping));
          break;
        case SelectionClear: {
          // If someone else took the selection, that's our sign to leave.
          fprintf(stderr, "%s: 0x%x took a selection from us; exiting\n",
                  kProgName,
                  static_cast<unsigned int>(event.xselectionclear.window));
          DestroyWindows();
          return;
        }
        default:
          fprintf(stderr, "%s: Ignoring event of type %d\n",
                  kProgName, event.type);
      }
    }

    // TODO: There's a small race condition here, in that SIGHUP can come
    // in while we're outside of the select() call, but it's probably not
    // worth trying to work around.

    fd_set fds;
    FD_ZERO(&fds);
    FD_SET(x11_fd, &fds);
    if (select(x11_fd + 1, &fds, NULL, NULL, NULL) == -1) {
      if (errno != EINTR) {
        fprintf(stderr, "%s: select() failed: %s\n",
                kProgName, strerror(errno));
        return;
      }

      fprintf(stderr, "%s: Reloading configuration\n", kProgName);
      if (!LoadConfig())
        continue;

      char data[kMaxPropertySize];
      DataWriter writer(data, kMaxPropertySize);
      if (!WriteProperty(&writer))
        continue;

      for (vector<Window>::const_iterator it = windows_.begin();
           it != windows_.end(); ++it) {
        SetPropertyOnWindow(*it, data, writer.bytes_written());
      }
    }
  }
}